

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::MaybeHaveInterfaceProperty
          (cmGeneratorTarget *this,string *prop,cmGeneratorExpressionContext *context,
          LinkInterfaceFor interfaceFor)

{
  uchar uVar1;
  pointer pcVar2;
  pointer pcVar3;
  long *plVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  _Var5;
  cmValue cVar6;
  cmLinkInterfaceLibraries *pcVar7;
  size_type *psVar8;
  cmGeneratorTarget *head;
  cmLinkItem *lib;
  pointer pcVar9;
  bool bVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>,_bool>
  pVar11;
  string key;
  __string_type __str;
  key_type local_70;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  pcVar2 = (prop->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + prop->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(context->Config)._M_dataplus._M_p);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70.field_2._8_8_ = plVar4[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  _Var5._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->MaybeInterfacePropertyExists)._M_h,&local_70);
  if (_Var5._M_cur == (__node_type *)0x0) {
    local_50 = (long *)((ulong)local_50 & 0xffffffffffffff00);
    pVar11 = std::
             _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::__cxx11::string_const&,bool>
                       ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)&this->MaybeInterfacePropertyExists,&local_70);
    _Var5._M_cur = (__node_type *)
                   pVar11.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                   ._M_cur;
    cVar6 = GetProperty(this,prop);
    if (cVar6.Value == (string *)0x0) {
      *(undefined1 *)((long)_Var5._M_cur + 0x28) = 0;
    }
    else {
      bVar10 = (cVar6.Value)->_M_string_length != 0;
      *(bool *)((long)_Var5._M_cur + 0x28) = bVar10;
      if (bVar10) goto LAB_005fefc7;
    }
    head = context->HeadTarget;
    if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
      head = this;
    }
    pcVar7 = GetLinkInterfaceLibraries(this,&context->Config,head,interfaceFor);
    if (pcVar7 != (cmLinkInterfaceLibraries *)0x0) {
      if (pcVar7->HadHeadSensitiveCondition == false) {
        pcVar3 = (pcVar7->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pcVar9 = (pcVar7->Libraries).
                      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                      super__Vector_impl_data._M_start; pcVar9 != pcVar3; pcVar9 = pcVar9 + 1) {
          if ((pcVar9->Target != (cmGeneratorTarget *)0x0) &&
             (bVar10 = MaybeHaveInterfaceProperty(pcVar9->Target,prop,context,interfaceFor), bVar10)
             ) goto LAB_005ff061;
        }
      }
      else {
LAB_005ff061:
        *(undefined1 *)((long)_Var5._M_cur + 0x28) = 1;
      }
    }
  }
LAB_005fefc7:
  uVar1 = ((_Var5._M_cur)->
          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
          ._M_storage._M_storage.__data[0x20];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar1;
}

Assistant:

bool cmGeneratorTarget::MaybeHaveInterfaceProperty(
  std::string const& prop, cmGeneratorExpressionContext* context,
  LinkInterfaceFor interfaceFor) const
{
  std::string const key = prop + '@' + context->Config;
  auto i = this->MaybeInterfacePropertyExists.find(key);
  if (i == this->MaybeInterfacePropertyExists.end()) {
    // Insert an entry now in case there is a cycle.
    i = this->MaybeInterfacePropertyExists.emplace(key, false).first;
    bool& maybeInterfaceProp = i->second;

    // If this target itself has a non-empty property value, we are done.
    maybeInterfaceProp = cmNonempty(this->GetProperty(prop));

    // Otherwise, recurse to interface dependencies.
    if (!maybeInterfaceProp) {
      cmGeneratorTarget const* headTarget =
        context->HeadTarget ? context->HeadTarget : this;
      if (cmLinkInterfaceLibraries const* iface =
            this->GetLinkInterfaceLibraries(context->Config, headTarget,
                                            interfaceFor)) {
        if (iface->HadHeadSensitiveCondition) {
          // With a different head target we may get to a library with
          // this interface property.
          maybeInterfaceProp = true;
        } else {
          // The transitive interface libraries do not depend on the
          // head target, so we can follow them.
          for (cmLinkItem const& lib : iface->Libraries) {
            if (lib.Target &&
                lib.Target->MaybeHaveInterfaceProperty(prop, context,
                                                       interfaceFor)) {
              maybeInterfaceProp = true;
              break;
            }
          }
        }
      }
    }
  }
  return i->second;
}